

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9GetNextExpr(SyToken *pStart,SyToken *pEnd,SyToken **ppNext)

{
  int local_34;
  SyToken *pSStack_30;
  sxi32 iNest;
  SyToken *pCur;
  SyToken **ppNext_local;
  SyToken *pEnd_local;
  SyToken *pStart_local;
  
  local_34 = 0;
  if ((pStart < pEnd) && (pSStack_30 = pStart, (pStart->nType & 0x40000) == 0)) {
    while ((pSStack_30 < pEnd && (((pSStack_30->nType & 0x60000) == 0 || (0 < local_34))))) {
      if ((pSStack_30->nType & 0xa40) == 0) {
        if ((pSStack_30->nType & 0x1480) != 0) {
          local_34 = local_34 + -1;
        }
      }
      else {
        local_34 = local_34 + 1;
      }
      pSStack_30 = pSStack_30 + 1;
    }
    *ppNext = pSStack_30;
    pStart_local._4_4_ = 0;
  }
  else {
    pStart_local._4_4_ = -0x12;
  }
  return pStart_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 jx9GetNextExpr(SyToken *pStart,SyToken *pEnd,SyToken **ppNext)
{
	SyToken *pCur = pStart;
	sxi32 iNest = 0;
	if( pCur >= pEnd || (pCur->nType & JX9_TK_SEMI/*';'*/) ){
		/* Last expression */
		return SXERR_EOF;
	}
	while( pCur < pEnd ){
		if( (pCur->nType & (JX9_TK_COMMA/*','*/|JX9_TK_SEMI/*';'*/)) && iNest <= 0){
			break;
		}
		if( pCur->nType & (JX9_TK_LPAREN/*'('*/|JX9_TK_OSB/*'['*/|JX9_TK_OCB/*'{'*/) ){
			iNest++;
		}else if( pCur->nType & (JX9_TK_RPAREN/*')'*/|JX9_TK_CSB/*']'*/|JX9_TK_CCB/*'}*/) ){
			iNest--;
		}
		pCur++;
	}
	*ppNext = pCur;
	return SXRET_OK;
}